

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * MemOSAlloc(sxu32 nBytes)

{
  sxu32 *psVar1;
  
  psVar1 = (sxu32 *)malloc((ulong)(nBytes + 4));
  if (psVar1 == (sxu32 *)0x0) {
    psVar1 = (sxu32 *)0x0;
  }
  else {
    *psVar1 = nBytes;
    psVar1 = psVar1 + 1;
  }
  return psVar1;
}

Assistant:

static void * MemOSAlloc(sxu32 nBytes)
{
	sxu32 *pChunk;
	pChunk = (sxu32 *)SyOSHeapAlloc(nBytes + sizeof(sxu32));
	if( pChunk == 0 ){
		return 0;
	}
	pChunk[0] = nBytes;
	return (void *)&pChunk[1];
}